

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Accuracy::Texture2DFilteringCase::init(Texture2DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  reference ppTVar1;
  Texture2D *this_01;
  ulong uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  PixelBufferAccess *access;
  pointer ppTVar8;
  int levelNdx;
  bool bVar9;
  RGBA local_110;
  RGBA local_10c;
  long local_108;
  ulong local_100;
  Vec4 cScale;
  Vec4 cBias;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vec4 gMin;
  Vec4 gMax;
  TextureFormatInfo fmtInfo;
  Vector<float,_4> local_50;
  tcu local_40 [16];
  
  this_00 = &this->m_textures;
  if ((this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
    iVar3 = 2;
    while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
      this_01 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_01,this->m_renderCtx,this->m_internalFormat,this->m_width,this->m_height);
      fmtInfo.valueMin.m_data._0_8_ = this_01;
      std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
                ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                 (Texture2D **)&fmtInfo);
    }
    uVar5 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar5 = this->m_width;
    }
    uVar4 = 0x20;
    if (uVar5 != 0) {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    tcu::getTextureFormatInfo
              (&fmtInfo,(TextureFormat *)
                        &(*(this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_refTexture);
    tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
    tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
    uVar2 = (ulong)(0x20 - uVar4);
    lVar7 = 0;
    local_100 = uVar2;
    for (uVar6 = 0; local_100 != uVar6; uVar6 = uVar6 + 1) {
      local_c8.m_data[0] = -0.5;
      local_c8.m_data[1] = -0.5;
      local_c8.m_data[2] = -0.5;
      local_c8.m_data[3] = 2.0;
      tcu::operator*((tcu *)&gMax,&local_c8,&cScale);
      tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&gMax,&cBias);
      local_d8.m_data[0] = 1.0;
      local_d8.m_data[1] = 1.0;
      local_d8.m_data[2] = 1.0;
      local_d8.m_data[3] = 0.0;
      tcu::operator*((tcu *)&local_c8,&local_d8,&cScale);
      tcu::operator+((tcu *)&gMax,&local_c8,&cBias);
      tcu::Texture2D::allocLevel
                (&(*(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start)->m_refTexture,(int)uVar6);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (*(long *)&((*(this_00->
                               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                            super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl + lVar7),&gMin,&gMax);
      lVar7 = lVar7 + 0x28;
      uVar2 = extraout_RAX;
    }
    local_108 = 0;
    for (uVar6 = 0; local_100 != uVar6; uVar6 = uVar6 + 1) {
      tcu::Texture2D::allocLevel
                (&(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar6);
      uVar5 = (int)(0xffffff / (ulong)(0x20 - uVar4)) * (int)uVar6;
      local_10c.m_value = uVar5 | 0xff000000;
      access = (PixelBufferAccess *)
               (*(long *)&((this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                          super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl + local_108);
      tcu::RGBA::toVec(&local_10c);
      tcu::operator*((tcu *)&gMax,&local_c8,&cScale);
      tcu::operator+((tcu *)&gMin,&gMax,&cBias);
      local_110.m_value = ~uVar5 | 0xff000000;
      tcu::RGBA::toVec(&local_110);
      tcu::operator*(local_40,&local_50,&cScale);
      tcu::operator+((tcu *)&local_d8,(Vector<float,_4> *)local_40,&cBias);
      tcu::fillWithGrid(access,4,&gMin,&local_d8);
      local_108 = local_108 + 0x28;
      uVar2 = extraout_RAX_00;
    }
    for (ppTVar8 = (this->m_textures).
                   super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start; iVar3 = (int)uVar2,
        ppTVar8 !=
        (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar8 = ppTVar8 + 1) {
      uVar5 = (*(*ppTVar8)->_vptr_Texture2D[2])();
      uVar2 = (ulong)uVar5;
    }
  }
  else {
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,1);
    fmtInfo.valueMin.m_data._0_8_ =
         glu::Texture2D::create
                   (this->m_renderCtx,this->m_renderCtxInfo,
                    ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                    (int)((ulong)((long)(this->m_filenames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_filenames).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5),
                    &this->m_filenames);
    ppTVar1 = std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
              emplace_back<glu::Texture2D*>
                        ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
                         (Texture2D **)&fmtInfo);
    iVar3 = (int)ppTVar1;
  }
  return iVar3;
}

Assistant:

void Texture2DFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames));
		}
		else
		{
			// Create 2 textures.
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::Texture2D(m_renderCtx, m_internalFormat, m_width, m_height));

			const int				numLevels	= deLog2Floor32(de::max(m_width, m_height))+1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first gradient texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				tcu::Vec4 gMin = tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
				tcu::Vec4 gMax = tcu::Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

				m_textures[0]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
			}

			// Fill second with grid texture.
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / numLevels;
				deUint32	rgb		= step*levelNdx;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel(levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}

			// Upload.
			for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DFilteringCase::deinit();
		throw;
	}
}